

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O3

int Gia_Truth6ToGia(Gia_Man_t *p,int *pVarLits,int nVars,word Truth,int fHash)

{
  long lVar1;
  long lVar2;
  int iData0;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  
  if (Truth == 0) {
    iVar3 = 0;
  }
  else {
    if (Truth != 0xffffffffffffffff) {
      if (nVars < 1) {
        __assert_fail("nVars > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                      ,0xb6,"int Gia_Truth6ToGia(Gia_Man_t *, int *, int, word, int)");
      }
      uVar5 = (ulong)(uint)nVars;
      iVar3 = 0;
      lVar6 = 0;
      do {
        if ((long)(uVar5 + lVar6) < 1) {
          __assert_fail("Var >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                        ,0xbb,"int Gia_Truth6ToGia(Gia_Man_t *, int *, int, word, int)");
        }
        bVar4 = (byte)(1 << ((char)nVars + -1 + (char)lVar6 & 0x1fU));
        lVar1 = lVar6 + -1;
        iVar3 = iVar3 + -1;
        lVar2 = lVar6 * 8;
        lVar6 = lVar1;
      } while ((*(ulong *)(uVar5 * 8 + 0x949cf8 + lVar2) & (Truth >> (bVar4 & 0x3f) ^ Truth)) == 0);
      if (uVar5 + lVar1 + 1 < 7) {
        iData0 = Gia_Truth6ToGia(p,pVarLits,iVar3 + nVars,
                                 (s_Truths6Neg[uVar5 + lVar1] & Truth) << (bVar4 & 0x3f) |
                                 s_Truths6Neg[uVar5 + lVar1] & Truth,fHash);
        iVar3 = Gia_Truth6ToGia(p,pVarLits,iVar3 + nVars,
                                (Truth & s_Truths6[uVar5 + lVar1]) >> (bVar4 & 0x3f) |
                                Truth & s_Truths6[uVar5 + lVar1],fHash);
        if (fHash != 0) {
          iVar3 = Gia_ManHashMux(p,pVarLits[uVar5 + lVar1],iVar3,iData0);
          return iVar3;
        }
        iVar3 = Gia_ManAppendMux(p,pVarLits[uVar5 + lVar1],iVar3,iData0);
        return iVar3;
      }
      __assert_fail("iVar >= 0 && iVar < 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x337,"word Abc_Tt6Cofactor0(word, int)");
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Gia_Truth6ToGia( Gia_Man_t * p, int * pVarLits, int nVars, word Truth, int fHash )
{
    int Var, Lit0, Lit1; 
    if ( Truth == 0 )
        return 0;
    if ( ~Truth == 0 )
        return 1;
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Abc_Tt6HasVar( Truth, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    Lit0 = Gia_Truth6ToGia( p, pVarLits, Var, Abc_Tt6Cofactor0(Truth, Var), fHash );
    Lit1 = Gia_Truth6ToGia( p, pVarLits, Var, Abc_Tt6Cofactor1(Truth, Var), fHash );
    if ( fHash )
        return Gia_ManHashMux( p, pVarLits[Var], Lit1, Lit0 );
    else
        return Gia_ManAppendMux( p, pVarLits[Var], Lit1, Lit0 );
}